

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBars<float>
               (char *label_id,float *xs,float *ys,float *err,int count,int offset,int stride)

{
  undefined1 local_60 [8];
  GetterError<float> getter;
  int offset_local;
  int count_local;
  float *err_local;
  float *ys_local;
  float *xs_local;
  char *label_id_local;
  
  getter.Stride = offset;
  getter._44_4_ = count;
  GetterError<float>::GetterError((GetterError<float> *)local_60,xs,ys,err,err,count,offset,stride);
  PlotErrorBarsEx<ImPlot::GetterError<float>>(label_id,(GetterError<float> *)local_60);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* err, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, err, err, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}